

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void finishFTSession(string *id,UDPClient *client)

{
  iterator this;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  char *pcVar4;
  int __fd;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_51;
  undefined1 local_50 [7];
  bool chksm;
  string check;
  FTSession *ref;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
  local_20;
  iterator it;
  UDPClient *client_local;
  string *id_local;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
  *__y;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
               )client;
  pthread_mutex_lock((pthread_mutex_t *)(ftSessionMutex + 1));
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>_>
       ::find(it.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
              ._M_cur,id);
  ref = (FTSession *)
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>_>
        ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>_>
               *)it.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                 ._M_cur);
  __y = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
         *)&ref;
  bVar1 = std::__detail::operator!=(&local_20,__y);
  __fd = (int)__y;
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
                           *)&local_20);
    nite::FileTransfer::FTSession::close(&ppVar2->second,__fd);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
                           *)&local_20);
    check.field_2._8_8_ = &ppVar2->second;
    nite::hashFile((string *)local_50,&(ppVar2->second).indexed.path);
    local_51 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(check.field_2._8_8_ + 0x58));
    if ((*(byte *)(check.field_2._8_8_ + 0xb0) & 1) == 0) {
      std::operator+(&local_1b8,"FT ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (check.field_2._8_8_ + 0x2e8));
      std::operator+(&local_198,&local_1b8," finished file \'");
      std::operator+(&local_178,&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (check.field_2._8_8_ + 0x58));
      std::operator+(&local_158,&local_178,"\' ");
      pcVar4 = "from";
      if ((*(byte *)(check.field_2._8_8_ + 0xb0) & 1) != 0) {
        pcVar4 = "to";
      }
      std::operator+(&local_138,&local_158,pcVar4);
      std::operator+(&local_118,&local_138," ");
      nite::IP_Port::operator_cast_to_string(&local_1e8,(IP_Port *)(check.field_2._8_8_ + 0x10));
      std::operator+(&local_f8,&local_118,&local_1e8);
      std::operator+(&local_d8,&local_f8," saved as \'");
      std::operator+(&local_b8,&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (check.field_2._8_8_ + 0x38));
      std::operator+(&local_98,&local_b8,"\': checksum match: ");
      pcVar4 = "false";
      if ((local_51 & 1) != 0) {
        pcVar4 = "true";
      }
      std::operator+(&local_78,&local_98,pcVar4);
      nite::print(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
                           *)&local_20);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
                           *)&local_20);
    std::function<void_(const_nite::IndexedFile_&,_bool)>::operator()
              (&(ppVar2->second).callback,&(ppVar3->second).indexed,(bool)(local_51 & 1));
    this = it;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_false,_true>
                           *)&local_20);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>_>
    ::erase((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>_>
             *)this.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
               ._M_cur,&ppVar2->first);
    std::__cxx11::string::~string((string *)local_50);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(ftSessionMutex + 1));
  return;
}

Assistant:

static void finishFTSession(const String &id, nite::FileTransfer::UDPClient *client){
	pthread_mutex_lock(&ftSessionMutex[1]); 
	auto it = client->sessions.find(id);
	if(it != client->sessions.end()){
		it->second.close();
		auto &ref = it->second;
		String check = nite::hashFile(ref.indexed.path);
		bool chksm = check == ref.indexed.hash;		
		if(!ref.sender){
			nite::print("FT "+ref.id+" finished file '"+ref.indexed.hash+"' "+(ref.sender ? "to" : "from")+" "+String(ref.ip)+" saved as '"+ref.indexed.path+"': checksum match: "+(chksm ? "true" : "false"));
		}
		it->second.callback(it->second.indexed, chksm);
		client->sessions.erase(it->first);
	}
	pthread_mutex_unlock(&ftSessionMutex[1]);
}